

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# qhostaddress.cpp
# Opt level: O2

void __thiscall QHostAddress::setAddress(QHostAddress *this,SpecialAddress address)

{
  quint32 a_;
  long in_FS_OFFSET;
  quint8 local_28 [16];
  long local_18;
  
  local_18 = *(long *)(in_FS_OFFSET + 0x28);
  clear(this);
  local_28[0] = '\0';
  local_28[1] = '\0';
  local_28[2] = '\0';
  local_28[3] = '\0';
  local_28[4] = '\0';
  local_28[5] = '\0';
  local_28[6] = '\0';
  local_28[7] = '\0';
  local_28[8] = '\0';
  local_28[9] = '\0';
  local_28[10] = '\0';
  local_28[0xb] = '\0';
  local_28[0xc] = '\0';
  local_28[0xd] = '\0';
  local_28[0xe] = '\0';
  local_28[0xf] = '\0';
  switch(address) {
  case Null:
    break;
  case Broadcast:
    a_ = 0xffffffff;
    goto LAB_001a05e3;
  case LocalHost:
    a_ = 0x7f000001;
    goto LAB_001a05e3;
  case LocalHostIPv6:
    local_28[8] = '\0';
    local_28[9] = '\0';
    local_28[10] = '\0';
    local_28[0xb] = '\0';
    local_28[0xc] = '\0';
    local_28[0xd] = '\0';
    local_28[0xe] = '\0';
    local_28[0xf] = '\x01';
  case AnyIPv6:
    QHostAddressPrivate::setAddress((this->d).d.ptr,local_28);
    break;
  case Any:
    ((this->d).d.ptr)->protocol = '\x02';
    break;
  default:
    a_ = 0;
LAB_001a05e3:
    if (*(long *)(in_FS_OFFSET + 0x28) == local_18) {
      QHostAddressPrivate::setAddress((this->d).d.ptr,a_);
      return;
    }
    goto LAB_001a0601;
  }
  if (*(long *)(in_FS_OFFSET + 0x28) == local_18) {
    return;
  }
LAB_001a0601:
  __stack_chk_fail();
}

Assistant:

void QHostAddress::setAddress(SpecialAddress address)
{
    clear();

    Q_IPV6ADDR ip6;
    memset(&ip6, 0, sizeof ip6);
    quint32 ip4 = INADDR_ANY;

    switch (address) {
    case Null:
        return;

    case Broadcast:
        ip4 = INADDR_BROADCAST;
        break;
    case LocalHost:
        ip4 = INADDR_LOOPBACK;
        break;
    case AnyIPv4:
        break;

    case LocalHostIPv6:
        ip6[15] = 1;
        Q_FALLTHROUGH();
    case AnyIPv6:
        d->setAddress(ip6);
        return;

    case Any:
        d->protocol = QHostAddress::AnyIPProtocol;
        return;
    }

    // common IPv4 part
    d->setAddress(ip4);
}